

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageWriterTests.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_101329::IsCorrectData<MILBlob::Fp8E5M2>
          (anon_unknown_dwarf_101329 *this,string *filePath,uint64_t offset,
          Span<const_MILBlob::Fp8E5M2,_18446744073709551615UL> expectedSpan)

{
  Span<const_MILBlob::Fp8E5M2,_18446744073709551615UL> expectedSpan_00;
  bool bVar1;
  uint64_t offset_local;
  string *filePath_local;
  Span<const_MILBlob::Fp8E5M2,_18446744073709551615UL> expectedSpan_local;
  
  expectedSpan_00.m_size.m_size = (size_t)expectedSpan.m_ptr;
  expectedSpan_00.m_ptr = (pointer)offset;
  bVar1 = IsCorrectDataImpl<MILBlob::Fp8E5M2>((string *)this,(uint64_t)filePath,expectedSpan_00);
  return bVar1;
}

Assistant:

[[nodiscard]] bool IsCorrectData(const std::string& filePath, uint64_t offset, Util::Span<const T> expectedSpan)
{
    if constexpr (MILBlob::IsSubByteSized<T>::value) {
        return IsCorrectSubByteData(filePath, offset, expectedSpan);
    } else {
        return IsCorrectDataImpl(filePath, offset, expectedSpan);
    }
}